

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int xmlParseDocument(xmlParserCtxtPtr ctxt)

{
  uint uVar1;
  xmlParserInputPtr pxVar2;
  setDocumentLocatorSAXFunc p_Var3;
  void *pvVar4;
  startDocumentSAXFunc p_Var5;
  xmlParserInputBufferPtr pxVar6;
  externalSubsetSAXFunc p_Var7;
  endDocumentSAXFunc p_Var8;
  xmlDocPtr pxVar9;
  xmlCharEncoding enc;
  int iVar10;
  undefined8 in_RAX;
  xmlSAXLocator *pxVar11;
  xmlChar *pxVar12;
  xmlChar start [4];
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  xmlInitParser();
  if ((ctxt != (xmlParserCtxtPtr)0x0) && (pxVar2 = ctxt->input, pxVar2 != (xmlParserInputPtr)0x0)) {
    if ((ctxt->progressive == 0) && ((long)pxVar2->end - (long)pxVar2->cur < 0xfa)) {
      xmlGROW(ctxt);
    }
    xmlDetectSAX2(ctxt);
    if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
       (p_Var3 = ctxt->sax->setDocumentLocator, p_Var3 != (setDocumentLocatorSAXFunc)0x0)) {
      pvVar4 = ctxt->userData;
      pxVar11 = __xmlDefaultSAXLocator();
      (*p_Var3)(pvVar4,pxVar11);
    }
    if (ctxt->instate != XML_PARSER_EOF) {
      if ((ctxt->encoding == (xmlChar *)0x0) &&
         (pxVar12 = ctxt->input->cur, 3 < (long)ctxt->input->end - (long)pxVar12)) {
        uStack_28 = CONCAT17(pxVar12[3],
                             CONCAT16(pxVar12[2],
                                      CONCAT15(pxVar12[1],CONCAT14(*pxVar12,(undefined4)uStack_28)))
                            );
        enc = xmlDetectCharEncoding((uchar *)((long)&uStack_28 + 4),4);
        if (enc != XML_CHAR_ENCODING_NONE) {
          xmlSwitchEncoding(ctxt,enc);
        }
      }
      pxVar12 = ctxt->input->cur;
      if (*pxVar12 == '\0') {
        xmlFatalErr(ctxt,XML_ERR_DOCUMENT_EMPTY,(char *)0x0);
      }
      else {
        if (((long)ctxt->input->end - (long)pxVar12 < 0x23) && (ctxt->progressive == 0)) {
          xmlGROW(ctxt);
        }
        pxVar12 = ctxt->input->cur;
        if ((((((*pxVar12 == '<') && (pxVar12[1] == '?')) && (pxVar12[2] == 'x')) &&
             ((pxVar12[3] == 'm' && (pxVar12[4] == 'l')))) && ((ulong)pxVar12[5] < 0x21)) &&
           ((0x100002600U >> ((ulong)pxVar12[5] & 0x3f) & 1) != 0)) {
          xmlParseXMLDecl(ctxt);
          if (ctxt->errNo == 0x20) {
            return -1;
          }
          if (ctxt->instate == XML_PARSER_EOF) {
            return -1;
          }
          ctxt->standalone = ctxt->input->standalone;
          xmlSkipBlankChars(ctxt);
        }
        else {
          pxVar12 = xmlCharStrdup("1.0");
          ctxt->version = pxVar12;
        }
        if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
            (p_Var5 = ctxt->sax->startDocument, p_Var5 != (startDocumentSAXFunc)0x0)) &&
           (ctxt->disableSAX == 0)) {
          (*p_Var5)(ctxt->userData);
        }
        if (ctxt->instate != XML_PARSER_EOF) {
          if ((((ctxt->myDoc != (xmlDocPtr)0x0) && (ctxt->input != (xmlParserInputPtr)0x0)) &&
              (pxVar6 = ctxt->input->buf, pxVar6 != (xmlParserInputBufferPtr)0x0)) &&
             (iVar10 = pxVar6->compressed, -1 < iVar10)) {
            ctxt->myDoc->compression = iVar10;
          }
          xmlParseMisc(ctxt);
          if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa))
          {
            xmlGROW(ctxt);
          }
          pxVar12 = ctxt->input->cur;
          if (((*pxVar12 == '<') && (pxVar12[1] == '!')) &&
             (((pxVar12[2] == 'D' &&
               (((pxVar12[3] == 'O' && (pxVar12[4] == 'C')) && (pxVar12[5] == 'T')))) &&
              (((pxVar12[6] == 'Y' && (pxVar12[7] == 'P')) && (pxVar12[8] == 'E')))))) {
            ctxt->inSubset = 1;
            xmlParseDocTypeDecl(ctxt);
            if (*ctxt->input->cur == '[') {
              ctxt->instate = XML_PARSER_DTD;
              xmlParseInternalSubset(ctxt);
              if (ctxt->instate == XML_PARSER_EOF) {
                return -1;
              }
            }
            ctxt->inSubset = 2;
            if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
                (p_Var7 = ctxt->sax->externalSubset, p_Var7 != (externalSubsetSAXFunc)0x0)) &&
               (ctxt->disableSAX == 0)) {
              (*p_Var7)(ctxt->userData,ctxt->intSubName,ctxt->extSubSystem,ctxt->extSubURI);
            }
            if (ctxt->instate == XML_PARSER_EOF) {
              return -1;
            }
            ctxt->inSubset = 0;
            xmlCleanSpecialAttr(ctxt);
            ctxt->instate = XML_PARSER_PROLOG;
            xmlParseMisc(ctxt);
          }
          if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa))
          {
            xmlGROW(ctxt);
          }
          if (*ctxt->input->cur == '<') {
            ctxt->instate = XML_PARSER_CONTENT;
            xmlParseElement(ctxt);
            ctxt->instate = XML_PARSER_EPILOG;
            xmlParseMisc(ctxt);
            if (*ctxt->input->cur != '\0') {
              xmlFatalErr(ctxt,XML_ERR_DOCUMENT_END,(char *)0x0);
            }
            ctxt->instate = XML_PARSER_EOF;
          }
          else {
            xmlFatalErrMsg(ctxt,XML_ERR_DOCUMENT_EMPTY,"Start tag expected, \'<\' not found\n");
          }
          if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
             (p_Var8 = ctxt->sax->endDocument, p_Var8 != (endDocumentSAXFunc)0x0)) {
            (*p_Var8)(ctxt->userData);
          }
          if ((ctxt->myDoc != (xmlDocPtr)0x0) &&
             (iVar10 = xmlStrEqual(ctxt->myDoc->version,(xmlChar *)"SAX compatibility mode document"
                                  ), iVar10 != 0)) {
            xmlFreeDoc(ctxt->myDoc);
            ctxt->myDoc = (xmlDocPtr)0x0;
          }
          iVar10 = ctxt->wellFormed;
          if (iVar10 != 0) {
            pxVar9 = ctxt->myDoc;
            if (pxVar9 != (xmlDocPtr)0x0) {
              uVar1 = pxVar9->properties;
              pxVar9->properties = uVar1 | 1;
              if (ctxt->valid != 0) {
                pxVar9->properties = uVar1 | 9;
              }
              if (ctxt->nsWellFormed != 0) {
                *(byte *)&pxVar9->properties = (byte)pxVar9->properties | 2;
              }
              if ((ctxt->options & 0x20000) != 0) {
                *(byte *)&pxVar9->properties = (byte)pxVar9->properties | 4;
              }
            }
            if (iVar10 != 0) {
              return 0;
            }
          }
          ctxt->valid = 0;
        }
      }
    }
  }
  return -1;
}

Assistant:

int
xmlParseDocument(xmlParserCtxtPtr ctxt) {
    xmlChar start[4];
    xmlCharEncoding enc;

    xmlInitParser();

    if ((ctxt == NULL) || (ctxt->input == NULL))
        return(-1);

    GROW;

    /*
     * SAX: detecting the level.
     */
    xmlDetectSAX2(ctxt);

    /*
     * SAX: beginning of the document processing.
     */
    if ((ctxt->sax) && (ctxt->sax->setDocumentLocator))
        ctxt->sax->setDocumentLocator(ctxt->userData, &xmlDefaultSAXLocator);
    if (ctxt->instate == XML_PARSER_EOF)
	return(-1);

    if ((ctxt->encoding == NULL) &&
        ((ctxt->input->end - ctxt->input->cur) >= 4)) {
	/*
	 * Get the 4 first bytes and decode the charset
	 * if enc != XML_CHAR_ENCODING_NONE
	 * plug some encoding conversion routines.
	 */
	start[0] = RAW;
	start[1] = NXT(1);
	start[2] = NXT(2);
	start[3] = NXT(3);
	enc = xmlDetectCharEncoding(&start[0], 4);
	if (enc != XML_CHAR_ENCODING_NONE) {
	    xmlSwitchEncoding(ctxt, enc);
	}
    }


    if (CUR == 0) {
	xmlFatalErr(ctxt, XML_ERR_DOCUMENT_EMPTY, NULL);
	return(-1);
    }

    /*
     * Check for the XMLDecl in the Prolog.
     * do not GROW here to avoid the detected encoder to decode more
     * than just the first line, unless the amount of data is really
     * too small to hold "<?xml version="1.0" encoding="foo"
     */
    if ((ctxt->input->end - ctxt->input->cur) < 35) {
       GROW;
    }
    if ((CMP5(CUR_PTR, '<', '?', 'x', 'm', 'l')) && (IS_BLANK_CH(NXT(5)))) {

	/*
	 * Note that we will switch encoding on the fly.
	 */
	xmlParseXMLDecl(ctxt);
	if ((ctxt->errNo == XML_ERR_UNSUPPORTED_ENCODING) ||
	    (ctxt->instate == XML_PARSER_EOF)) {
	    /*
	     * The XML REC instructs us to stop parsing right here
	     */
	    return(-1);
	}
	ctxt->standalone = ctxt->input->standalone;
	SKIP_BLANKS;
    } else {
	ctxt->version = xmlCharStrdup(XML_DEFAULT_VERSION);
    }
    if ((ctxt->sax) && (ctxt->sax->startDocument) && (!ctxt->disableSAX))
        ctxt->sax->startDocument(ctxt->userData);
    if (ctxt->instate == XML_PARSER_EOF)
	return(-1);
    if ((ctxt->myDoc != NULL) && (ctxt->input != NULL) &&
        (ctxt->input->buf != NULL) && (ctxt->input->buf->compressed >= 0)) {
	ctxt->myDoc->compression = ctxt->input->buf->compressed;
    }

    /*
     * The Misc part of the Prolog
     */
    xmlParseMisc(ctxt);

    /*
     * Then possibly doc type declaration(s) and more Misc
     * (doctypedecl Misc*)?
     */
    GROW;
    if (CMP9(CUR_PTR, '<', '!', 'D', 'O', 'C', 'T', 'Y', 'P', 'E')) {

	ctxt->inSubset = 1;
	xmlParseDocTypeDecl(ctxt);
	if (RAW == '[') {
	    ctxt->instate = XML_PARSER_DTD;
	    xmlParseInternalSubset(ctxt);
	    if (ctxt->instate == XML_PARSER_EOF)
		return(-1);
	}

	/*
	 * Create and update the external subset.
	 */
	ctxt->inSubset = 2;
	if ((ctxt->sax != NULL) && (ctxt->sax->externalSubset != NULL) &&
	    (!ctxt->disableSAX))
	    ctxt->sax->externalSubset(ctxt->userData, ctxt->intSubName,
	                              ctxt->extSubSystem, ctxt->extSubURI);
	if (ctxt->instate == XML_PARSER_EOF)
	    return(-1);
	ctxt->inSubset = 0;

        xmlCleanSpecialAttr(ctxt);

	ctxt->instate = XML_PARSER_PROLOG;
	xmlParseMisc(ctxt);
    }

    /*
     * Time to start parsing the tree itself
     */
    GROW;
    if (RAW != '<') {
	xmlFatalErrMsg(ctxt, XML_ERR_DOCUMENT_EMPTY,
		       "Start tag expected, '<' not found\n");
    } else {
	ctxt->instate = XML_PARSER_CONTENT;
	xmlParseElement(ctxt);
	ctxt->instate = XML_PARSER_EPILOG;


	/*
	 * The Misc part at the end
	 */
	xmlParseMisc(ctxt);

	if (RAW != 0) {
	    xmlFatalErr(ctxt, XML_ERR_DOCUMENT_END, NULL);
	}
	ctxt->instate = XML_PARSER_EOF;
    }

    /*
     * SAX: end of the document processing.
     */
    if ((ctxt->sax) && (ctxt->sax->endDocument != NULL))
        ctxt->sax->endDocument(ctxt->userData);

    /*
     * Remove locally kept entity definitions if the tree was not built
     */
    if ((ctxt->myDoc != NULL) &&
	(xmlStrEqual(ctxt->myDoc->version, SAX_COMPAT_MODE))) {
	xmlFreeDoc(ctxt->myDoc);
	ctxt->myDoc = NULL;
    }

    if ((ctxt->wellFormed) && (ctxt->myDoc != NULL)) {
        ctxt->myDoc->properties |= XML_DOC_WELLFORMED;
	if (ctxt->valid)
	    ctxt->myDoc->properties |= XML_DOC_DTDVALID;
	if (ctxt->nsWellFormed)
	    ctxt->myDoc->properties |= XML_DOC_NSVALID;
	if (ctxt->options & XML_PARSE_OLD10)
	    ctxt->myDoc->properties |= XML_DOC_OLD10;
    }
    if (! ctxt->wellFormed) {
	ctxt->valid = 0;
	return(-1);
    }
    return(0);
}